

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export-lora.cpp
# Opt level: O1

void __thiscall
lora_merge_ctx::lora_merge_ctx
          (lora_merge_ctx *this,string *base_fname,
          vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_> *lora_files,
          string *outfile,int n_threads)

{
  ofstream *this_00;
  float scale;
  pointer pcVar1;
  pointer pcVar2;
  long lVar3;
  tuple<file_input_*,_std::default_delete<file_input>_> this_01;
  gguf_context *pgVar4;
  ggml_context *pgVar5;
  ggml_backend_t pgVar6;
  undefined8 uVar7;
  ggml_gallocr_t pgVar8;
  runtime_error *this_02;
  pointer pcVar9;
  unique_ptr<file_input,_std::default_delete<file_input>_> adapter;
  string fname;
  __uniq_ptr_impl<file_input,_std::default_delete<file_input>_> local_78;
  ofstream *local_70;
  string local_68;
  long local_48;
  undefined8 uStack_40;
  undefined1 local_38;
  
  file_input::file_input(&this->base_model,base_fname,0.0);
  (this->adapters).
  super__Vector_base<std::unique_ptr<file_input,_std::default_delete<file_input>_>,_std::allocator<std::unique_ptr<file_input,_std::default_delete<file_input>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->adapters).
  super__Vector_base<std::unique_ptr<file_input,_std::default_delete<file_input>_>,_std::allocator<std::unique_ptr<file_input,_std::default_delete<file_input>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->adapters).
  super__Vector_base<std::unique_ptr<file_input,_std::default_delete<file_input>_>,_std::allocator<std::unique_ptr<file_input,_std::default_delete<file_input>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->n_threads = n_threads;
  this_00 = &this->fout;
  this->backend = (ggml_backend_t)0x0;
  this->allocr = (ggml_gallocr_t)0x0;
  (this->read_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->read_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->read_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ofstream::ofstream(this_00,(string *)outfile,_S_bin);
  lVar3 = *(long *)(*(long *)this_00 + -0x18);
  *(undefined4 *)(&this->field_0x2c4 + lVar3) = 4;
  local_70 = this_00;
  std::ios::clear((int)this_00 + (int)lVar3);
  lVar3 = gguf_find_key((this->base_model).ctx_gguf,"split.count");
  if (lVar3 < 0) {
    pcVar9 = (lora_files->
             super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pcVar1 = (lora_files->
             super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pcVar9 != pcVar1) {
      do {
        pcVar2 = (pcVar9->path)._M_dataplus._M_p;
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,pcVar2,pcVar2 + (pcVar9->path)._M_string_length);
        scale = pcVar9->scale;
        this_01.super__Tuple_impl<0UL,_file_input_*,_std::default_delete<file_input>_>.
        super__Head_base<0UL,_file_input_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_file_input_*,_std::default_delete<file_input>_>)operator_new(0x250);
        file_input::file_input
                  ((file_input *)
                   this_01.super__Tuple_impl<0UL,_file_input_*,_std::default_delete<file_input>_>.
                   super__Head_base<0UL,_file_input_*,_false>._M_head_impl,&local_68,scale);
        local_78._M_t.super__Tuple_impl<0UL,_file_input_*,_std::default_delete<file_input>_>.
        super__Head_base<0UL,_file_input_*,_false>._M_head_impl =
             (tuple<file_input_*,_std::default_delete<file_input>_>)
             (tuple<file_input_*,_std::default_delete<file_input>_>)
             this_01.super__Tuple_impl<0UL,_file_input_*,_std::default_delete<file_input>_>.
             super__Head_base<0UL,_file_input_*,_false>._M_head_impl;
        check_metadata_lora(this,(file_input *)
                                 this_01.
                                 super__Tuple_impl<0UL,_file_input_*,_std::default_delete<file_input>_>
                                 .super__Head_base<0UL,_file_input_*,_false>._M_head_impl);
        std::
        vector<std::unique_ptr<file_input,std::default_delete<file_input>>,std::allocator<std::unique_ptr<file_input,std::default_delete<file_input>>>>
        ::emplace_back<std::unique_ptr<file_input,std::default_delete<file_input>>>
                  ((vector<std::unique_ptr<file_input,std::default_delete<file_input>>,std::allocator<std::unique_ptr<file_input,std::default_delete<file_input>>>>
                    *)&this->adapters,
                   (unique_ptr<file_input,_std::default_delete<file_input>_> *)&local_78);
        std::unique_ptr<file_input,_std::default_delete<file_input>_>::~unique_ptr
                  ((unique_ptr<file_input,_std::default_delete<file_input>_> *)&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        pcVar9 = pcVar9 + 1;
      } while (pcVar9 != pcVar1);
    }
    pgVar4 = (gguf_context *)gguf_init_empty();
    this->ctx_out = pgVar4;
    lVar3 = gguf_get_n_tensors((this->base_model).ctx_gguf);
    local_48 = ggml_tensor_overhead();
    local_48 = local_48 * lVar3;
    uStack_40 = 0;
    local_38 = 1;
    pgVar5 = (ggml_context *)ggml_init();
    this->ctx_out_ggml = pgVar5;
    pgVar6 = (ggml_backend_t)ggml_backend_cpu_init();
    this->backend = pgVar6;
    uVar7 = ggml_backend_get_default_buffer_type(pgVar6);
    pgVar8 = (ggml_gallocr_t)ggml_gallocr_new(uVar7);
    this->allocr = pgVar8;
    return;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_02,"split model is not yet supported");
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

lora_merge_ctx(
            std::string & base_fname,
            std::vector<common_adapter_lora_info> & lora_files,
            std::string & outfile,
            int n_threads) : base_model(base_fname, 0), n_threads(n_threads), fout(outfile, std::ios::binary) {
        fout.exceptions(std::ofstream::failbit); // fail fast on write errors

        if (gguf_find_key(base_model.ctx_gguf, LLM_KV_SPLIT_COUNT) >= 0) {
            throw std::runtime_error("split model is not yet supported");
        }

        for (auto & lora_inp : lora_files) {
            auto fname = lora_inp.path;
            auto scale = lora_inp.scale;
            std::unique_ptr<file_input> adapter(new file_input(fname, scale));
            check_metadata_lora(adapter.get());
            adapters.push_back(std::move(adapter));
        }

        ctx_out = gguf_init_empty();
        struct ggml_init_params params = {
            /*.mem_size   =*/ gguf_get_n_tensors(base_model.ctx_gguf)*ggml_tensor_overhead(),
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ true,
        };
        ctx_out_ggml = ggml_init(params);
        backend = ggml_backend_cpu_init();
        allocr = ggml_gallocr_new(ggml_backend_get_default_buffer_type(backend));
    }